

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Own<kj::Directory> __thiscall kj::newInMemoryDirectory(kj *this,Clock *clock)

{
  Own<kj::(anonymous_namespace)::InMemoryDirectory> OVar1;
  Own<kj::Directory> OVar2;
  undefined8 local_20;
  undefined8 local_18;
  
  OVar1 = atomicRefcounted<kj::(anonymous_namespace)::InMemoryDirectory,kj::Clock_const&>
                    ((kj *)&local_20,clock);
  OVar2.ptr = OVar1.ptr;
  *(undefined8 *)this = local_20;
  *(undefined8 *)(this + 8) = local_18;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<Directory> newInMemoryDirectory(const Clock& clock) {
  return atomicRefcounted<InMemoryDirectory>(clock);
}